

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O0

FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
* __thiscall
Inferences::
FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
::meet(FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
       *this,FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
             *rhs)

{
  bool bVar1;
  AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral> *pAVar2;
  AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral> *in_RDX;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  *in_RDI;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  *lhs;
  AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral> *in_stack_ffffffffffffff68
  ;
  AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral> *in_stack_ffffffffffffffc0
  ;
  AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral> *in_stack_ffffffffffffffc8
  ;
  
  bVar1 = Lib::
          Coproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
          ::is<Inferences::Bot>
                    ((Coproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                      *)0x737238);
  if (bVar1) {
    bot();
  }
  else {
    bVar1 = Lib::
            Coproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
            ::is<Inferences::Bot>
                      ((Coproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                        *)0x737257);
    if (bVar1) {
      bot();
    }
    else {
      Lib::
      Coproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,Inferences::Bot>
      ::unwrap<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>>
                ((Coproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  *)0x737276);
      AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>::AnyNumber
                (in_RDX,in_stack_ffffffffffffff68);
      pAVar2 = Lib::
               Coproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,Inferences::Bot>
               ::
               unwrap<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>>
                         ((Coproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                           *)0x73728d);
      AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>::AnyNumber
                (in_RDX,pAVar2);
      meet(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>::~AnyNumber
                ((AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral> *)0x7372c3
                );
      AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>::~AnyNumber
                ((AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral> *)0x7372cd
                );
    }
  }
  return in_RDI;
}

Assistant:

FlatMeetLattice meet(FlatMeetLattice rhs) 
  {
    auto& lhs = *this;

    if (lhs._inner.template is<Bot>()) return bot();
    if (rhs._inner.template is<Bot>()) return bot();

    return meet(lhs._inner.template unwrap<A>(), rhs._inner.template unwrap<A>());
  }